

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O0

void nni_reap(nni_reap_list *rl,void *item)

{
  nni_reap_node *pnVar1;
  nni_reap_node *node;
  void *item_local;
  nni_reap_list *rl_local;
  
  nni_mtx_lock(&reap_mtx);
  if ((rl->rl_inited & 1U) == 0) {
    rl->rl_inited = true;
    rl->rl_next = reap_list;
    reap_list = rl;
  }
  reap_empty = false;
  pnVar1 = (nni_reap_node *)((long)item + rl->rl_offset);
  pnVar1->rn_next = rl->rl_nodes;
  rl->rl_nodes = pnVar1;
  nni_cv_wake1(&reap_work_cv);
  nni_mtx_unlock(&reap_mtx);
  return;
}

Assistant:

void
nni_reap(nni_reap_list *rl, void *item)
{
	nni_reap_node *node;

	nni_mtx_lock(&reap_mtx);
	if (!rl->rl_inited) {
		rl->rl_inited = true;
		rl->rl_next   = reap_list;
		reap_list     = rl;
	}
	reap_empty    = false;
	node          = (void *) ((char *) item + rl->rl_offset);
	node->rn_next = rl->rl_nodes;
	rl->rl_nodes  = node;
	nni_cv_wake1(&reap_work_cv);
	nni_mtx_unlock(&reap_mtx);
}